

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
* __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
::operator++(iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
             *this)

{
  bool bVar1;
  LogMessage *other;
  _Self *__x;
  Node *pNVar2;
  _Self local_80;
  map<std::reference_wrapper<const_google::protobuf::MapKey>,_void_*,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
  *local_78;
  Tree *tree;
  byte local_59;
  LogMessage local_58;
  undefined1 local_19;
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>
  _Stack_18;
  bool is_list;
  TreeIterator tree_it;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  *this_local;
  
  if (this->node_->next == (Node *)0x0) {
    tree_it._M_node = (_Base_ptr)this;
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>
    ::_Rb_tree_iterator(&stack0xffffffffffffffe8);
    local_19 = revalidate_if_necessary(this,&stack0xffffffffffffffe8);
    if ((bool)local_19) {
      SearchFrom(this,this->bucket_index_ + 1);
    }
    else {
      local_59 = 0;
      if ((this->bucket_index_ & 1) != 0) {
        internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                   ,0x239);
        local_59 = 1;
        other = internal::LogMessage::operator<<
                          (&local_58,"CHECK failed: (bucket_index_ & 1) == (0u): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),other);
      }
      if ((local_59 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_58);
      }
      local_78 = (map<std::reference_wrapper<const_google::protobuf::MapKey>,_void_*,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
                  *)this->m_->table_[this->bucket_index_];
      __x = std::
            _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>
            ::operator++(&stack0xffffffffffffffe8);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::reference_wrapper<const_google::protobuf::MapKey>,_void_*,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
           ::end(local_78);
      bVar1 = std::operator==(__x,&local_80);
      if (bVar1) {
        SearchFrom(this,this->bucket_index_ + 2);
      }
      else {
        pNVar2 = NodeFromTreeIterator((TreeIterator)_Stack_18._M_node);
        this->node_ = pNVar2;
      }
    }
  }
  else {
    this->node_ = this->node_->next;
  }
  return this;
}

Assistant:

iterator_base& operator++() {
        if (node_->next == nullptr) {
          TreeIterator tree_it;
          const bool is_list = revalidate_if_necessary(&tree_it);
          if (is_list) {
            SearchFrom(bucket_index_ + 1);
          } else {
            GOOGLE_DCHECK_EQ(bucket_index_ & 1, 0u);
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            if (++tree_it == tree->end()) {
              SearchFrom(bucket_index_ + 2);
            } else {
              node_ = NodeFromTreeIterator(tree_it);
            }
          }
        } else {
          node_ = node_->next;
        }
        return *this;
      }